

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::XFileParser::ParseDataObjectAnimationKey(XFileParser *this,AnimBone *pAnimBone)

{
  uint uVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_2e0 [376];
  string local_168;
  undefined1 local_148 [8];
  MatrixKey key_2;
  string local_f8;
  aiVector3D local_d8;
  double local_c4;
  float local_bc;
  undefined1 local_b8 [8];
  aiVectorKey key_1;
  string local_98;
  undefined1 local_78 [8];
  aiQuatKey key;
  allocator<char> local_49;
  string local_48;
  uint local_28;
  uint local_24;
  uint time;
  uint a;
  uint numKeys;
  uint keyType;
  AnimBone *pAnimBone_local;
  XFileParser *this_local;
  
  _numKeys = pAnimBone;
  pAnimBone_local = (AnimBone *)this;
  readHeadOfDataObject(this,(string *)0x0);
  a = ReadInt(this);
  time = ReadInt(this);
  local_24 = 0;
  do {
    if (time <= local_24) {
      CheckForClosingBrace(this);
      return;
    }
    local_28 = ReadInt(this);
    if (a == 0) {
      uVar1 = ReadInt(this);
      if (uVar1 != 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Invalid number of arguments for quaternion key in animation"
                   ,&local_49);
        ThrowException(this,&local_48);
      }
      aiQuatKey::aiQuatKey((aiQuatKey *)local_78);
      local_78 = (undefined1  [8])(double)local_28;
      key.mTime._0_4_ = ReadFloat(this);
      key.mTime._4_4_ = ReadFloat(this);
      key.mValue.w = ReadFloat(this);
      key.mValue.x = ReadFloat(this);
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::push_back
                (&_numKeys->mRotKeys,(value_type *)local_78);
      CheckForSemicolon(this);
    }
    else if (a - 1 < 2) {
      uVar1 = ReadInt(this);
      if (uVar1 != 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Invalid number of arguments for vector key in animation",
                   (allocator<char> *)&key_1.field_0x17);
        ThrowException(this,&local_98);
      }
      aiVectorKey::aiVectorKey((aiVectorKey *)local_b8);
      local_b8 = (undefined1  [8])(double)local_28;
      local_d8 = ReadVector3(this);
      local_c4 = (double)local_d8._0_8_;
      local_bc = local_d8.z;
      key_1.mTime = (double)local_d8._0_8_;
      key_1.mValue.x = local_d8.z;
      if (a == 2) {
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                  (&_numKeys->mPosKeys,(value_type *)local_b8);
      }
      else {
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                  (&_numKeys->mScaleKeys,(value_type *)local_b8);
      }
    }
    else {
      if (1 < a - 3) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2e0);
        pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(local_2e0,(char (*) [18])"Unknown key type ");
        pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar2,&a);
        this_00 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator<<(pbVar2,(char (*) [15])" in animation.");
        Formatter::basic_formatter::operator_cast_to_string(&local_168,this_00);
        ThrowException(this,&local_168);
      }
      uVar1 = ReadInt(this);
      if (uVar1 != 0x10) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"Invalid number of arguments for matrix key in animation",
                   (allocator<char> *)((long)&key_2.mMatrix.d4 + 3));
        ThrowException(this,&local_f8);
      }
      XFile::MatrixKey::MatrixKey((MatrixKey *)local_148);
      local_148 = (undefined1  [8])(double)local_28;
      key_2.mTime._0_4_ = ReadFloat(this);
      key_2.mMatrix.a3 = ReadFloat(this);
      key_2.mMatrix.b3 = ReadFloat(this);
      key_2.mMatrix.c3 = ReadFloat(this);
      key_2.mTime._4_4_ = ReadFloat(this);
      key_2.mMatrix.a4 = ReadFloat(this);
      key_2.mMatrix.b4 = ReadFloat(this);
      key_2.mMatrix.c4 = ReadFloat(this);
      key_2.mMatrix.a1 = ReadFloat(this);
      key_2.mMatrix.b1 = ReadFloat(this);
      key_2.mMatrix.c1 = ReadFloat(this);
      key_2.mMatrix.d1 = ReadFloat(this);
      key_2.mMatrix.a2 = ReadFloat(this);
      key_2.mMatrix.b2 = ReadFloat(this);
      key_2.mMatrix.c2 = ReadFloat(this);
      key_2.mMatrix.d2 = ReadFloat(this);
      std::vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::push_back
                (&_numKeys->mTrafoKeys,(value_type *)local_148);
      CheckForSemicolon(this);
    }
    CheckForSeparator(this);
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectAnimationKey( AnimBone* pAnimBone)
{
    readHeadOfDataObject();

    // read key type
    unsigned int keyType = ReadInt();

    // read number of keys
    unsigned int numKeys = ReadInt();

    for( unsigned int a = 0; a < numKeys; a++)
    {
        // read time
        unsigned int time = ReadInt();

        // read keys
        switch( keyType)
        {
            case 0: // rotation quaternion
            {
                // read count
                if( ReadInt() != 4)
                    ThrowException( "Invalid number of arguments for quaternion key in animation");

                aiQuatKey key;
                key.mTime = double( time);
                key.mValue.w = ReadFloat();
                key.mValue.x = ReadFloat();
                key.mValue.y = ReadFloat();
                key.mValue.z = ReadFloat();
                pAnimBone->mRotKeys.push_back( key);

                CheckForSemicolon();
                break;
            }

            case 1: // scale vector
            case 2: // position vector
            {
                // read count
                if( ReadInt() != 3)
                    ThrowException( "Invalid number of arguments for vector key in animation");

                aiVectorKey key;
                key.mTime = double( time);
                key.mValue = ReadVector3();

                if( keyType == 2)
                    pAnimBone->mPosKeys.push_back( key);
                else
                    pAnimBone->mScaleKeys.push_back( key);

                break;
            }

            case 3: // combined transformation matrix
            case 4: // denoted both as 3 or as 4
            {
                // read count
                if( ReadInt() != 16)
                    ThrowException( "Invalid number of arguments for matrix key in animation");

                // read matrix
                MatrixKey key;
                key.mTime = double( time);
                key.mMatrix.a1 = ReadFloat(); key.mMatrix.b1 = ReadFloat();
                key.mMatrix.c1 = ReadFloat(); key.mMatrix.d1 = ReadFloat();
                key.mMatrix.a2 = ReadFloat(); key.mMatrix.b2 = ReadFloat();
                key.mMatrix.c2 = ReadFloat(); key.mMatrix.d2 = ReadFloat();
                key.mMatrix.a3 = ReadFloat(); key.mMatrix.b3 = ReadFloat();
                key.mMatrix.c3 = ReadFloat(); key.mMatrix.d3 = ReadFloat();
                key.mMatrix.a4 = ReadFloat(); key.mMatrix.b4 = ReadFloat();
                key.mMatrix.c4 = ReadFloat(); key.mMatrix.d4 = ReadFloat();
                pAnimBone->mTrafoKeys.push_back( key);

                CheckForSemicolon();
                break;
            }

            default:
                ThrowException( format() << "Unknown key type " << keyType << " in animation." );
                break;
        } // end switch

        // key separator
        CheckForSeparator();
    }

    CheckForClosingBrace();
}